

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computationTest.cpp
# Opt level: O1

void __thiscall Computation_FG_Test::TestBody(Computation_FG_Test *this)

{
  lattice *grid;
  double dVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  double **F;
  double **G;
  double **RHS;
  char *pcVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  AssertionResult gtest_ar;
  double errRHS;
  double errG;
  double errF;
  double init [3];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  internal local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double **local_b0;
  double **local_a8;
  char **local_a0;
  double local_98 [4];
  fluidSim local_78;
  
  local_98[0] = 0.773;
  local_98[1] = 14.567;
  local_98[2] = 0.0;
  grid = &(this->super_Computation).grid;
  initUVP(&(this->super_Computation).U,&(this->super_Computation).V,&(this->super_Computation).P,
          (this->super_Computation).grid.deli,(this->super_Computation).grid.delj,local_98);
  F = create2Dfield((this->super_Computation).grid.deli + 1,(this->super_Computation).grid.delj + 1)
  ;
  G = create2Dfield((this->super_Computation).grid.deli + 1,(this->super_Computation).grid.delj + 1)
  ;
  RHS = create2Dfield((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  local_a0 = create2DIntegerField
                       ((this->super_Computation).grid.deli,(this->super_Computation).grid.delj);
  local_78.Re = 1000.0;
  local_78.alpha = 0.0;
  local_78.GX = 0.0;
  local_78.GY = 0.0;
  compFG((this->super_Computation).U,(this->super_Computation).V,F,G,local_a0,0.5,grid,&local_78);
  local_b0 = RHS;
  local_a8 = G;
  compRHS(F,G,RHS,grid,0.5);
  local_b8 = 0.0;
  local_c0 = 0.0;
  local_c8 = 0.0;
  uVar2 = (this->super_Computation).grid.deli;
  if (0 < (int)uVar2) {
    dVar1 = 0.0;
    dVar8 = 0.0;
    dVar9 = 0.0;
    iVar3 = (this->super_Computation).grid.delj;
    lVar6 = 1;
    do {
      if (0 < iVar3) {
        lVar7 = 0;
        do {
          dVar10 = F[lVar6 + -1][lVar7 + 1] - (this->super_Computation).U[lVar6][lVar7 + 1];
          dVar9 = dVar9 + dVar10 * dVar10;
          dVar10 = local_a8[lVar6][lVar7] - (this->super_Computation).V[lVar6][lVar7 + 1];
          dVar8 = dVar8 + dVar10 * dVar10;
          dVar1 = dVar1 + local_b0[lVar6 + -1][lVar7] * local_b0[lVar6 + -1][lVar7];
          lVar7 = lVar7 + 1;
          local_c8 = dVar1;
          local_c0 = dVar8;
          local_b8 = dVar9;
        } while ((ulong)(iVar3 + 1) - 1 != lVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != (ulong)uVar2 + 1);
  }
  destroy2Dfield((this->super_Computation).U,uVar2 + 3);
  destroy2Dfield((this->super_Computation).V,(this->super_Computation).grid.deli + 2);
  destroy2Dfield((this->super_Computation).P,(this->super_Computation).grid.deli + 2);
  destroy2Dfield(F,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(local_a8,(this->super_Computation).grid.deli + 1);
  destroy2Dfield(local_b0,(this->super_Computation).grid.deli);
  destroy2Dfield(local_a0,(this->super_Computation).grid.deli + 2);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errF","1e-4",&local_b8,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errG","1e-4",&local_c0,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_e8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f1a36e2eb1c432d;
  testing::internal::CmpHelperLE<double,double>
            (local_d8,"errRHS","1e-4",&local_c8,(double *)&local_e8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/computationTest.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_e8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      local_e8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(Computation, FG)
{
	REAL init[3] = {0.773,14.567,0};
	initUVP(&U,&V,&P,grid.deli,grid.delj,init);
	REAL **F = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **G = create2Dfield(grid.deli+1, grid.delj+1);
	REAL **rhs = create2Dfield(grid.deli,grid.delj);
	char **FLAG = create2DIntegerField(grid.deli,grid.delj);

	fluidSim sim;
	sim.Re = 1000;
	sim.GX = 0;
	sim.GY = 0;
	sim.alpha = 0;
	compFG(U,V,F,G,FLAG,0.5,&grid,&sim);
	compRHS(F,G,rhs,&grid,0.5);
	REAL errF = 0, errG = 0, errRHS = 0;
	for (int i = 1; i <= grid.deli; i++)
		for (int j = 1; j <= grid.delj; j++)
		{
			errF += sqr(F[i-1][j] - U[i][j]);
			errG += sqr(G[i][j-1] - V[i][j]);
			errRHS += sqr(rhs[i-1][j-1]);
		}

	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	destroy2Dfield((void**)F,grid.deli+1);
	destroy2Dfield((void**)G,grid.deli+1);
	destroy2Dfield((void**)rhs,grid.deli);
	destroy2Dfield((void**)FLAG,grid.deli+2);

	EXPECT_LE(errF,1e-4);
	EXPECT_LE(errG,1e-4);
	EXPECT_LE(errRHS,1e-4);
}